

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplication::setPalette(QPalette *palette,char *className)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (className == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QGuiApplication::setPalette(palette);
      return;
    }
  }
  else {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_38,palette);
    if (QApplicationPrivate::app_style != (QStyle *)0x0) {
      QPalette::resolveMask();
      (**(code **)(*(long *)QApplicationPrivate::app_style + 0x80))
                (QApplicationPrivate::app_style,local_38);
      QPalette::setResolveMask((ulonglong)local_38);
    }
    QByteArray::QByteArray((QByteArray *)&local_50,className,-1);
    QHash<QByteArray,QPalette>::emplace<QPalette_const&>
              ((QHash<QByteArray,QPalette> *)&QApplicationPrivate::widgetPalettes,
               (QByteArray *)&local_50,(QPalette *)local_38);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    if (QCoreApplication::self != 0) {
      (**(code **)(**(long **)(QCoreApplication::self + 8) + 0xa0))
                (*(long **)(QCoreApplication::self + 8),className);
    }
    QPalette::~QPalette((QPalette *)local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QApplication::setPalette(const QPalette &palette, const char* className)
{
    if (className) {
        QPalette polishedPalette = palette;
        if (QApplicationPrivate::app_style) {
            auto originalResolveMask = palette.resolveMask();
            QApplicationPrivate::app_style->polish(polishedPalette);
            polishedPalette.setResolveMask(originalResolveMask);
        }

        QApplicationPrivate::widgetPalettes.insert(className, polishedPalette);
        if (qApp)
            qApp->d_func()->handlePaletteChanged(className);
    } else {
        QGuiApplication::setPalette(palette);
    }
}